

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlru_cache.hpp
# Opt level: O0

void __thiscall
cappuccino::
tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::do_prune(tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
           *this,time_point now)

{
  bool bVar1;
  type *__rhs;
  type_conflict2 *ptVar2;
  reference pvVar3;
  size_t lru_idx;
  type_conflict2 *element_idx;
  type *expire_time;
  pair<const_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_unsigned_long>
  *local_20;
  tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  *local_18;
  tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  *this_local;
  time_point now_local;
  
  if (this->m_used_size != 0) {
    local_18 = this;
    this_local = (tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
                  *)now.__d.__r;
    expire_time = (type *)std::
                          multimap<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_unsigned_long,_std::less<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_unsigned_long>_>_>
                          ::begin(&this->m_ttl_list);
    local_20 = std::
               _Rb_tree_iterator<std::pair<const_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_unsigned_long>_>
               ::operator*((_Rb_tree_iterator<std::pair<const_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_unsigned_long>_>
                            *)&expire_time);
    __rhs = std::
            get<0ul,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>
                      (local_20);
    ptVar2 = std::
             get<1ul,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>
                       (local_20);
    bVar1 = std::chrono::operator>=
                      ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&this_local,__rhs);
    if (bVar1) {
      do_erase(this,*ptVar2);
    }
    else {
      pvVar3 = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::back
                         (&this->m_lru_list);
      do_erase(this,*pvVar3);
    }
  }
  return;
}

Assistant:

auto do_prune(std::chrono::steady_clock::time_point now) -> void
    {
        if (m_used_size > 0)
        {
            auto& [expire_time, element_idx] = *m_ttl_list.begin();

            if (now >= expire_time)
            {
                // If there is an expired item, prefer to remove that.
                do_erase(element_idx);
            }
            else
            {
                // Otherwise pick the least recently used item to prune.
                size_t lru_idx = m_lru_list.back();
                do_erase(lru_idx);
            }
        }
    }